

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

EmitInfo __thiscall
Wasm::WasmBytecodeGenerator::EmitBinExpr
          (WasmBytecodeGenerator *this,OpCodeAsmJs op,WasmType *signature)

{
  WasmType expectedType;
  RegSlot location_;
  WasmRegisterSpace *this_00;
  EmitInfo EStack_44;
  RegSlot resultReg;
  EmitInfo lhs;
  EmitInfo rhs;
  WasmType rhsType;
  WasmType lhsType;
  WasmType resultType;
  WasmType *signature_local;
  WasmBytecodeGenerator *pWStack_18;
  OpCodeAsmJs op_local;
  WasmBytecodeGenerator *this_local;
  
  rhsType = *signature;
  expectedType = signature[1];
  _lhsType = signature;
  signature_local._6_2_ = op;
  pWStack_18 = this;
  lhs = PopEvalStack(this,signature[2],(char16 *)0x0);
  EStack_44 = PopEvalStack(this,expectedType,(char16 *)0x0);
  ReleaseLocation(this,&lhs);
  ReleaseLocation(this,&stack0xffffffffffffffbc);
  this_00 = GetRegisterSpace(this,rhsType);
  location_ = WAsmJs::RegisterSpace::AcquireTmpRegister(this_00);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x10])
            (this->m_writer,(ulong)signature_local._6_2_,(ulong)location_,
             (ulong)EStack_44 & 0xffffffff,(ulong)lhs & 0xffffffff);
  EmitInfo::EmitInfo((EmitInfo *)&this_local,location_,&rhsType);
  return (EmitInfo)this_local;
}

Assistant:

EmitInfo WasmBytecodeGenerator::EmitBinExpr(Js::OpCodeAsmJs op, const WasmTypes::WasmType* signature)
{
    WasmTypes::WasmType resultType = signature[0];
    WasmTypes::WasmType lhsType = signature[1];
    WasmTypes::WasmType rhsType = signature[2];

    EmitInfo rhs = PopEvalStack(rhsType);
    EmitInfo lhs = PopEvalStack(lhsType);

    ReleaseLocation(&rhs);
    ReleaseLocation(&lhs);

    Js::RegSlot resultReg = GetRegisterSpace(resultType)->AcquireTmpRegister();

    m_writer->AsmReg3(op, resultReg, lhs.location, rhs.location);

    return EmitInfo(resultReg, resultType);
}